

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.h
# Opt level: O0

int __thiscall imrt::Station::get_sum_alpha(Station *this,string *strategy)

{
  bool bVar1;
  int iVar2;
  reference pdVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  long in_RDI;
  double dVar4;
  int j;
  int i_1;
  double i;
  const_iterator __end3;
  const_iterator __begin3;
  vector<double,_std::allocator<double>_> *__range3;
  int intens;
  undefined4 in_stack_ffffffffffffff98;
  int iVar5;
  undefined4 in_stack_ffffffffffffff9c;
  int local_48;
  int local_44;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_30;
  long local_28;
  int local_1c;
  int local_4;
  
  local_1c = 0;
  bVar1 = std::operator==(in_RSI,(char *)CONCAT44(in_stack_ffffffffffffff9c,
                                                  in_stack_ffffffffffffff98));
  if (bVar1) {
    local_28 = in_RDI + 200;
    local_30._M_current =
         (double *)
         std::vector<double,_std::allocator<double>_>::begin
                   ((vector<double,_std::allocator<double>_> *)
                    CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    std::vector<double,_std::allocator<double>_>::end
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                          *)in_RSI,
                         (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                          *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      if (!bVar1) break;
      pdVar3 = __gnu_cxx::
               __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
               operator*(&local_30);
      local_1c = (int)((double)local_1c + *pdVar3);
      __gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator++(&local_30);
    }
    local_4 = local_1c;
  }
  else {
    bVar1 = std::operator==(in_RSI,(char *)CONCAT44(in_stack_ffffffffffffff9c,
                                                    in_stack_ffffffffffffff98));
    if (bVar1) {
      local_44 = 0;
      while( true ) {
        iVar5 = local_44;
        iVar2 = Collimator::getXdim(*(Collimator **)(in_RDI + 0xb0));
        if (iVar2 <= iVar5) break;
        local_48 = 0;
        while( true ) {
          iVar5 = local_48;
          iVar2 = Collimator::getYdim(*(Collimator **)(in_RDI + 0xb0));
          if (iVar2 <= iVar5) break;
          dVar4 = maths::Matrix::operator()((Matrix *)(in_RDI + 0xb8),local_44,local_48);
          if ((double)local_1c < dVar4) {
            dVar4 = maths::Matrix::operator()((Matrix *)(in_RDI + 0xb8),local_44,local_48);
            local_1c = (int)dVar4;
          }
          local_48 = local_48 + 1;
        }
        local_44 = local_44 + 1;
      }
      local_4 = local_1c;
    }
    else {
      local_4 = local_1c;
    }
  }
  return local_4;
}

Assistant:

int get_sum_alpha(string strategy) const{
    int intens=0;
    if(strategy=="dao_ls"){
      for(auto i:intensity) intens+=i;
      return (intens);
    }else if(strategy=="ibo_ls"){
	    for (int i=0; i<collimator.getXdim();i++)
		    for (int j=0; j<collimator.getYdim(); j++)
          if(I(i,j)>intens) intens=I(i,j);
      return (intens);
    }
    return(intens);
  }